

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp1_fast(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int blockSize_00;
  int iVar1;
  ulong x;
  word temp;
  int blockSize;
  int i;
  int *pDifStart_local;
  int nWords_local;
  int iVar_local;
  word *pInOut_local;
  
  blockSize_00 = 1 << ((byte)iVar & 0x1f);
  temp._4_4_ = nWords + -1;
  while( true ) {
    if (temp._4_4_ < 0) {
      *pDifStart = 0;
      return 1;
    }
    if (0x3f < blockSize_00 * 2) break;
    x = (pInOut[temp._4_4_] & SFmask[iVar][1]) << ((byte)blockSize_00 & 0x3f) ^
        (pInOut[temp._4_4_] & SFmask[iVar][2]) << ((byte)(blockSize_00 << 1) & 0x3f);
    if (x != 0) {
      iVar1 = firstShiftWithOneBit(x,blockSize_00);
      *pDifStart = (temp._4_4_ * 100 + 0x14) - iVar1;
      if ((pInOut[temp._4_4_] & SFmask[iVar][1]) << ((byte)blockSize_00 & 0x3f) <
          (pInOut[temp._4_4_] & SFmask[iVar][2]) << ((byte)(blockSize_00 << 1) & 0x3f)) {
        return 1;
      }
      return 2;
    }
    temp._4_4_ = temp._4_4_ + -1;
  }
  __assert_fail("2*blockSize < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/lucky/luckyFast16.c"
                ,0xa3,"int minTemp1_fast(word *, int, int, int *)");
}

Assistant:

int minTemp1_fast(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( 2*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][1])<<(blockSize)) ^ ((pInOut[i] & SFmask[iVar][2])<<(2*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][1])<<(blockSize)) < ((pInOut[i] & SFmask[iVar][2])<<(2*blockSize)) )
                return 1;
            else
                return 2;
        }
    }
    *pDifStart=0;
    return 1;
}